

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3ArrayAllocate(sqlite3 *db,void *pArray,int szEntry,int *pnEntry,int *pIdx)

{
  undefined8 *puVar1;
  int iVar2;
  void *pvVar3;
  undefined4 in_register_00000014;
  int *piVar4;
  u64 n;
  ulong uVar5;
  
  piVar4 = (int *)CONCAT44(in_register_00000014,szEntry);
  iVar2 = *piVar4;
  uVar5 = (ulong)iVar2;
  *pnEntry = iVar2;
  pvVar3 = pArray;
  if ((uVar5 & uVar5 - 1) == 0) {
    n = 0x20;
    if (iVar2 != 0) {
      n = uVar5 << 6;
    }
    pvVar3 = sqlite3DbRealloc(db,pArray,n);
    if (pvVar3 == (void *)0x0) {
      *pnEntry = -1;
      return pArray;
    }
  }
  puVar1 = (undefined8 *)((long)pvVar3 + uVar5 * 0x20 + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)pvVar3 + uVar5 * 0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  *piVar4 = *piVar4 + 1;
  return pvVar3;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ArrayAllocate(
  sqlite3 *db,      /* Connection to notify of malloc failures */
  void *pArray,     /* Array of objects.  Might be reallocated */
  int szEntry,      /* Size of each object in the array */
  int *pnEntry,     /* Number of objects currently in use */
  int *pIdx         /* Write the index of a new slot here */
){
  char *z;
  sqlite3_int64 n = *pIdx = *pnEntry;
  if( (n & (n-1))==0 ){
    sqlite3_int64 sz = (n==0) ? 1 : 2*n;
    void *pNew = sqlite3DbRealloc(db, pArray, sz*szEntry);
    if( pNew==0 ){
      *pIdx = -1;
      return pArray;
    }
    pArray = pNew;
  }
  z = (char*)pArray;
  memset(&z[n * szEntry], 0, szEntry);
  ++*pnEntry;
  return pArray;
}